

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefs.c
# Opt level: O2

int Abc_NodeMffcLabel(Abc_Obj_t *pNode,Vec_Ptr_t *vNodes)

{
  int iVar1;
  int iVar2;
  
  iVar1 = Abc_NodeDeref_rec(pNode);
  Abc_NtkIncrementTravId(pNode->pNtk);
  Abc_NodeMffcLabel_rec(pNode,1,vNodes);
  iVar2 = Abc_NodeRef_rec(pNode);
  if (iVar1 == iVar2) {
    return iVar1;
  }
  __assert_fail("Count1 == Count2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcRefs.c"
                ,0x1c1,"int Abc_NodeMffcLabel(Abc_Obj_t *, Vec_Ptr_t *)");
}

Assistant:

int Abc_NodeMffcLabel( Abc_Obj_t * pNode, Vec_Ptr_t * vNodes )
{
    int Count1, Count2;
    // dereference the node
    Count1 = Abc_NodeDeref_rec( pNode );
    // collect the nodes inside the MFFC
    Abc_NtkIncrementTravId( pNode->pNtk );
    Abc_NodeMffcLabel_rec( pNode, 1, vNodes );
    // reference it back
    Count2 = Abc_NodeRef_rec( pNode );
    assert( Count1 == Count2 );
    return Count1;
}